

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O3

void __thiscall
Js::LoopEntryPointInfo::LoopEntryPointInfo
          (LoopEntryPointInfo *this,LoopHeader *loopHeader,JavascriptLibrary *library)

{
  EntryPointInfo::EntryPointInfo
            (&this->super_EntryPointInfo,(JavascriptMethod)0x0,library,(ThreadContext *)0x0,true);
  (this->super_EntryPointInfo).super_ProxyEntryPointInfo.super_ExpirableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_014da798;
  Memory::Recycler::WBSetBit((char *)&this->loopHeader);
  (this->loopHeader).ptr = loopHeader;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->loopHeader);
  this->used = false;
  this->jittedLoopIterationsSinceLastBailout = 0;
  this->totalJittedLoopIterations = 0;
  return;
}

Assistant:

LoopEntryPointInfo(LoopHeader* loopHeader, Js::JavascriptLibrary* library) :
            EntryPointInfo(nullptr, library, /*threadContext*/ nullptr, /*isLoopBody*/ true),
            loopHeader(loopHeader),
            jittedLoopIterationsSinceLastBailout(0),
            totalJittedLoopIterations(0)
#ifdef BGJIT_STATS
            ,used(false)
#endif
        { }